

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall Lexer::add_token_id(Lexer *this,TokenKind tokenKind)

{
  ulong uVar1;
  uchar *__first;
  long lVar2;
  long lVar3;
  TextPos *args_1;
  size_type sVar4;
  size_type local_40;
  unsigned_long local_38;
  uchar *local_30;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  const_iterator local_20;
  TokenKind local_14;
  Lexer *pLStack_10;
  TokenKind tokenKind_local;
  Lexer *this_local;
  
  local_14 = tokenKind;
  pLStack_10 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_28._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&(this->data).ids)
    ;
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_20,&local_28);
    __first = (uchar *)std::__cxx11::string::operator[]((ulong)&this->tok_id);
    lVar2 = std::__cxx11::string::operator[]((ulong)&this->tok_id);
    lVar3 = std::__cxx11::string::size();
    local_30 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<unsigned_char*,void>
                                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                   &(this->data).ids,local_20,__first,(uchar *)(lVar2 + lVar3));
  }
  args_1 = CharReader::pos(&this->reader);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&(this->data).ids);
  lVar2 = std::__cxx11::string::size();
  local_38 = sVar4 - lVar2;
  local_40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&(this->data).ids);
  LexData::add_token<TokenKind&,TextPos_const&,unsigned_long,unsigned_long>
            (&this->data,&local_14,args_1,&local_38,&local_40);
  std::__cxx11::string::clear();
  return;
}

Assistant:

void Lexer::add_token_id(TokenKind tokenKind)
{
  if (!tok_id.empty())
    data.ids.insert(data.ids.end(),
                    (uint8_t*)&tok_id[0],
                    (uint8_t*)&tok_id[0]+tok_id.size());
  data.add_token(tokenKind,
                 reader.pos(),
                 data.ids.size()-tok_id.size(),
                 data.ids.size());
  tok_id.clear();
}